

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_157::FunctionDirectizer::create(FunctionDirectizer *this)

{
  TableInfoMap *tables;
  FunctionDirectizer *this_00;
  long in_RSI;
  
  tables = *(TableInfoMap **)(in_RSI + 0x130);
  this_00 = (FunctionDirectizer *)operator_new(0x140);
  FunctionDirectizer(this_00,tables);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionDirectizer>(tables);
  }